

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::dump_path_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,Path *path)

{
  ostream *poVar1;
  string *psVar2;
  stringstream ss;
  stringstream asStack_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  poVar1 = std::operator<<(local_198,"Path: Prim part = ");
  std::operator<<(poVar1,(string *)this);
  poVar1 = std::operator<<(local_198,", Prop part = ");
  std::operator<<(poVar1,(string *)(this + 0x20));
  poVar1 = std::operator<<(local_198,", Variant part = ");
  psVar2 = Path::variant_part_abi_cxx11_((Path *)this);
  std::operator<<(poVar1,(string *)psVar2);
  poVar1 = std::operator<<(local_198,", elementName = ");
  psVar2 = Path::element_name_abi_cxx11_((Path *)this);
  std::operator<<(poVar1,(string *)psVar2);
  poVar1 = std::operator<<(local_198,", isValid = ");
  std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(local_198,", isAbsolute = ");
  std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(local_198,", isRelative = ");
  std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string dump_path(const Path &path) {
  std::stringstream ss;
  ss << "Path: Prim part = " << path.prim_part();
  ss << ", Prop part = " << path.prop_part();
  ss << ", Variant part = " << path.variant_part();
  ss << ", elementName = " << path.element_name();
  ss << ", isValid = " << path.is_valid();
  ss << ", isAbsolute = " << path.is_absolute_path();
  ss << ", isRelative = " << path.is_relative_path();

  return ss.str();
}